

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

FieldDescriptor * __thiscall
google::protobuf::DescriptorPool::FindExtensionByName(DescriptorPool *this,ConstStringParam name)

{
  Tables *this_00;
  Symbol SVar1;
  StringPiece local_28;
  
  this_00 = (this->tables_)._M_t.
            super___uniq_ptr_impl<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
            ._M_t.
            super__Tuple_impl<0UL,_google::protobuf::DescriptorPool::Tables_*,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
            .super__Head_base<0UL,_google::protobuf::DescriptorPool::Tables_*,_false>._M_head_impl;
  stringpiece_internal::StringPiece::StringPiece<std::allocator<char>>(&local_28,name);
  SVar1 = Tables::FindByNameHelper(this_00,this,local_28);
  if ((SVar1.ptr_ == (SymbolBase *)0x0) || ((SVar1.ptr_)->symbol_type_ != '\x02')) {
    SVar1.ptr_ = (SymbolBase *)(FieldDescriptor *)0x0;
  }
  else if ((SVar1.ptr_[1].symbol_type_ & 8) == 0) {
    SVar1.ptr_ = (SymbolBase *)(FieldDescriptor *)0x0;
  }
  return (FieldDescriptor *)SVar1.ptr_;
}

Assistant:

const FieldDescriptor* DescriptorPool::FindExtensionByName(
    ConstStringParam name) const {
  if (const FieldDescriptor* field =
          tables_->FindByNameHelper(this, name).field_descriptor()) {
    if (field->is_extension()) {
      return field;
    }
  }
  return nullptr;
}